

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O0

char * zlib_level_strategy_name(int compression_level)

{
  char *pcStack_10;
  int compression_level_local;
  
  if (compression_level == 0) {
    pcStack_10 = "";
  }
  else if (zlib_strategy == 2) {
    pcStack_10 = "huffman ";
  }
  else if (zlib_strategy == 3) {
    pcStack_10 = "rle ";
  }
  else if (zlib_strategy == 0) {
    pcStack_10 = "";
  }
  else {
    error_exit("bad strategy",zlib_strategy);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* zlib_level_strategy_name(int compression_level) {
  if (compression_level == 0)
    return "";  // strategy is meaningless at level 0
  if (zlib_strategy == Z_HUFFMAN_ONLY)
    return "huffman ";
  if (zlib_strategy == Z_RLE)
    return "rle ";
  if (zlib_strategy == Z_DEFAULT_STRATEGY)
    return "";
  error_exit("bad strategy", zlib_strategy);
  return nullptr;
}